

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coverage.cpp
# Opt level: O0

void __thiscall
Coverage_invalidNamespaceElement_Test::Coverage_invalidNamespaceElement_Test
          (Coverage_invalidNamespaceElement_Test *this)

{
  Coverage_invalidNamespaceElement_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Coverage_invalidNamespaceElement_Test_0014aca0;
  return;
}

Assistant:

TEST(Coverage, invalidNamespaceElement)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"modelA\">\n"
        "  <component name=\"componentA\" xmlns=\"http://www.cellml.org/notcellml/2.0#\">\n"
        "    <variable name=\"variable1\" units=\"dimensionless\"/>\n"
        "  </component>\n"
        "</model>\n";

    libcellml::ParserPtr p = libcellml::Parser::create();
    p->parseModel(in);
    EXPECT_EQ(size_t(3), p->issueCount());
}